

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_algoim_K.H
# Opt level: O0

void __thiscall
amrex::algoim::
ImplicitIntegral<2,_3,_amrex::algoim::EBPlane,_amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_true>,_false>
::tensorProductIntegral
          (ImplicitIntegral<2,_3,_amrex::algoim::EBPlane,_amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_true>,_false>
           *this)

{
  int iVar1;
  long in_RDI;
  literals *this_00;
  Real RVar2;
  Real RVar3;
  int m;
  int k;
  int dim;
  Real w;
  GpuArray<double,_3U> x;
  int iloop;
  GpuArray<int,_2U> i;
  int i_1;
  int nloops;
  Real gauss_w [4];
  Real gauss_x [4];
  undefined1 in_stack_000001c0 [24];
  int in_stack_fffffffffffffec4;
  int local_114;
  int local_f8;
  int local_f4;
  literals local_e8 [28];
  int local_cc;
  ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_true> local_c8;
  undefined8 local_88;
  undefined8 local_80;
  int local_6c;
  long local_68;
  int local_5c;
  literals *local_58;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_true>
  *in_stack_ffffffffffffffb8;
  
  local_c8.xint.arr[1].alpha = 0.06943184420297371;
  local_c8.xint.arr[2].alpha = 0.33000947820757187;
  local_88 = 0x3fe5708ff6774f7f;
  local_80 = 0x3fedc736de7b1cc3;
  local_c8.free.arr[0] = true;
  local_c8.free.arr[1] = true;
  local_c8.free.arr[2] = true;
  local_c8.psi.arr[0].bits = 0xf7;
  local_c8.psi.arr[1].bits = '@';
  local_c8.psi.arr[2].bits = 'C';
  local_c8.psi.arr[3].bits = 0xc6;
  local_c8._23_1_ = 0x3f;
  local_c8.psiCount = -0x7bf3db36;
  local_c8._28_4_ = 0x3fd4de5f;
  local_c8.e0 = -0x7bf3db36;
  local_c8._36_4_ = 0x3fd4de5f;
  local_c8.xint.arr[0].alpha = 0.17392742256872692;
  local_c8.f._4_4_ = 1;
  for (local_c8.f._0_4_ = 0; (int)local_c8.f < 2; local_c8.f._0_4_ = (int)local_c8.f + 1) {
    local_c8.f._4_4_ = local_c8.f._4_4_ << 2;
  }
  memset(&local_c8,0,8);
  for (local_cc = 0; local_cc < local_c8.f._4_4_; local_cc = local_cc + 1) {
    this_00 = local_e8;
    memset(this_00,0,0x18);
    literals::operator____rt(this_00,(longdouble)1);
    local_f8 = 0;
    for (local_f4 = 0; local_f4 < 3; local_f4 = local_f4 + 1) {
      local_68 = in_RDI + 0x10;
      local_6c = local_f4;
      if ((*(byte *)(local_68 + local_f4) & 1) != 0) {
        RVar2 = BoundingBox<3>::min(in_stack_fffffffffffffec4);
        RVar3 = BoundingBox<3>::extent(in_stack_fffffffffffffec4);
        local_58 = local_e8;
        local_5c = local_f4;
        *(double *)(local_58 + (long)local_f4 * 8) =
             RVar3 * local_c8.xint.arr
                     [(long)*(int *)((long)&local_c8.free + (long)local_f8 * 4 + -0x10) + 1].alpha +
             RVar2;
        BoundingBox<3>::extent(in_stack_fffffffffffffec4);
        local_f8 = local_f8 + 1;
      }
    }
    in_stack_fffffffffffffec4 = SUB84(local_e8._8_8_,4);
    ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_true>::
    evalIntegrand(in_stack_ffffffffffffffb8,(GpuArray<double,_3U>)in_stack_000001c0,
                  (Real)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    local_114 = 1;
    iVar1 = local_114;
    while ((local_114 = iVar1, -1 < local_114 &&
           (*(int *)((long)&local_c8.free + (long)local_114 * 4 + -0x10) =
                 *(int *)((long)&local_c8.free + (long)local_114 * 4 + -0x10) + 1,
           3 < *(int *)((long)&local_c8.free + (long)local_114 * 4 + -0x10)))) {
      in_stack_ffffffffffffffb8 = &local_c8;
      *(undefined4 *)((long)&in_stack_ffffffffffffffb8->free + (long)local_114 * 4 + -0x10) = 0;
      iVar1 = local_114 + -1;
      in_stack_ffffffffffffffb4 = local_114;
    }
  }
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    void tensorProductIntegral () noexcept
    {
        constexpr Real gauss_x[4]={0.069431844202973712388026755553595247452_rt,
                                   0.33000947820757186759866712044837765640_rt,
                                   0.66999052179242813240133287955162234360_rt,
                                   0.93056815579702628761197324444640475255_rt};
        constexpr Real gauss_w[4]={0.173927422568726928686531974610999703618_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.173927422568726928686531974610999703618_rt};

        int nloops = 1;
        for (int i = 0; i < M; ++i) {
            nloops *= p;
        }
        GpuArray<int,M> i{}; // i is initialized to zero.
        for (int iloop = 0; iloop < nloops; ++iloop)
        {
            GpuArray<Real,N> x{};
            Real w = 1.0_rt;
            for (int dim = 0, k = 0; dim < N; ++dim) {
                if (free[dim]) {
                    x[dim] = xrange.min(dim) + xrange.extent(dim) * gauss_x[i[k]];
                    w *= xrange.extent(dim) * gauss_w[i[k]];
                    ++k;
                }
            }
            f.evalIntegrand(x, w);

            for (int m = M-1; m >= 0; --m) {
                ++(i[m]);
                if (i[m] < p) {
                    break;
                } else {
                    i[m] = 0;
                }
            }
        }
    }